

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

IMutableContext * Catch::getCurrentMutableContext(void)

{
  IMutableContext *pIVar1;
  Context *unaff_retaddr;
  
  if ((anonymous_namespace)::currentContext == (IMutableContext *)0x0) {
    pIVar1 = (IMutableContext *)operator_new(0x50);
    Context::Context(unaff_retaddr);
    (anonymous_namespace)::currentContext = pIVar1;
  }
  return (anonymous_namespace)::currentContext;
}

Assistant:

IMutableContext& getCurrentMutableContext() {
        if( !currentContext )
            currentContext = new Context();
        return *currentContext;
    }